

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vector<State,_std::allocator<State>_> *
ParseLine(vector<State,_std::allocator<State>_> *__return_storage_ptr__,string *rowString)

{
  istream *piVar1;
  char c;
  State local_1b0;
  int n;
  istringstream my_stream;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&my_stream,(string *)rowString,_S_in);
  (__return_storage_ptr__->super__Vector_base<State,_std::allocator<State>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<State,_std::allocator<State>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<State,_std::allocator<State>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    piVar1 = (istream *)std::istream::operator>>((istream *)&my_stream,&n);
    piVar1 = std::operator>>(piVar1,&c);
    if ((((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) || (c != ',')) break;
    if (n == 0) {
      local_1b0 = kEmpty;
      std::vector<State,_std::allocator<State>_>::emplace_back<State>
                (__return_storage_ptr__,&local_1b0);
    }
    else {
      local_1b0 = kObstacle;
      std::vector<State,_std::allocator<State>_>::emplace_back<State>
                (__return_storage_ptr__,&local_1b0);
    }
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&my_stream);
  return __return_storage_ptr__;
}

Assistant:

vector<State> ParseLine( string rowString )
{
// parseLine function accepts a string as it's parameter and parses the line read from the file to
// extract the data from the file, store them into variable, converts them to the enumerated datatype
// and stores the enumerated data type to vector and returns it.

    istringstream my_stream(rowString);
    // Creates an object of istringstream class which is used to process the string.

    char c;
    int n;
    vector<State> rowVector;
    // Initialise the variables to be used to fetch the value from the string.

    while(my_stream >> n >> c && c ==',')
    {
        // Streams string till the string is non empty and is a combination of integer and a character,
        // further checks if the string ends with comma(,)
        if(n == 0)
        {
            // If element is zero, we mark it as empty element.
            rowVector.push_back(State::kEmpty);
        }
        else
        {
            // If element is non-zero we mark it as an obstacle.
            rowVector.push_back(State::kObstacle);
        }
    }

    return rowVector;
    // Returns a row in the form of vector after processing the input string.
}